

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-from-text.cpp
# Opt level: O2

void __thiscall yactfr::internal::JsonValBuilder::onObjEnd(JsonValBuilder *this,TextLocation *loc)

{
  type objValCont;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
  local_40;
  
  std::_Rb_tree_header::_Rb_tree_header
            (&local_40._M_impl.super__Rb_tree_header,
             &(this->_stack).
              super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].objValCont._M_t._M_impl.
              super__Rb_tree_header);
  std::
  vector<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
  ::pop_back(&this->_stack);
  _handleVal<std::map<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>>
            (this,loc,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
                       *)&local_40);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

void onObjEnd(const TextLocation& loc)
    {
        auto objValCont = std::move(this->_stackTop().objValCont);

        _stack.pop_back();
        this->_handleVal(loc, std::move(objValCont));
    }